

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.c
# Opt level: O0

int spi_write(uint addr,uint len,uint8_t *data)

{
  bool bVar1;
  undefined1 *local_78;
  spi_ioc_transfer xfer [2];
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  int iStack_24;
  uint8_t msg_buf [3];
  int i;
  int ret;
  uint8_t *data_local;
  uint len_local;
  uint addr_local;
  
  xfer[0].tx_buf = 0;
  xfer[0].rx_buf._4_4_ = speed;
  xfer[0].len._0_2_ = delay;
  xfer[0].len._2_1_ = bits;
  xfer[0].len._3_1_ = 0;
  xfer[0].speed_hz._0_1_ = 0;
  xfer[0].speed_hz._1_1_ = 0;
  xfer[0].speed_hz._2_1_ = 0;
  xfer[0].speed_hz._3_1_ = 0;
  xfer[1].rx_buf._4_4_ = speed;
  xfer[1].len._0_2_ = delay;
  xfer[1].len._2_1_ = bits;
  xfer[1].len._3_1_ = 0;
  xfer[1].speed_hz._0_1_ = 0;
  xfer[1].speed_hz._1_1_ = 0;
  xfer[1].speed_hz._2_1_ = 0;
  xfer[1].speed_hz._3_1_ = 0;
  local_2b = 0;
  local_2a = (undefined1)(addr >> 8);
  local_29 = (undefined1)addr;
  local_78 = &local_2b;
  xfer[0].rx_buf._0_4_ = 3;
  if ((mode & 0x200) == 0) {
    if ((mode & 0x100) != 0) {
      xfer[1].speed_hz._0_1_ = 2;
    }
  }
  else {
    xfer[1].speed_hz._0_1_ = 4;
  }
  if ((mode & 0x800) == 0) {
    if ((mode & 0x400) != 0) {
      xfer[1].speed_hz._1_1_ = 2;
    }
  }
  else {
    xfer[1].speed_hz._1_1_ = 4;
  }
  xfer[0]._24_8_ = data;
  if ((((mode & 0x20) == 0) && ((mode & 0x300) == 0)) && ((mode & 0xc00) != 0)) {
    xfer[0].delay_usecs = 0;
    xfer[0].bits_per_word = '\0';
    xfer[0].cs_change = '\0';
    xfer[0].tx_nbits = '\0';
    xfer[0].rx_nbits = '\0';
    xfer[0].word_delay_usecs = '\0';
    xfer[0].pad = '\0';
  }
  xfer[1].tx_buf = 0;
  xfer[1].rx_buf._0_4_ = len;
  iStack_24 = ioctl(i2s_fd,0x40406b00,&local_78);
  bVar1 = iStack_24 < 1;
  if (bVar1) {
    pabort("write: can\'t send spi message");
  }
  len_local = (uint)bVar1;
  return len_local;
}

Assistant:

static int spi_write(unsigned int addr, unsigned int len, const uint8_t *data)
{
	int ret;
	int i;
	//int out_fd;
	uint8_t msg_buf[3];
	struct spi_ioc_transfer xfer[2] = {
		{
		.tx_buf = (unsigned long)0,
		.rx_buf = (unsigned long)0,
		.len = 3,
		.delay_usecs = delay,
		.speed_hz = speed,
		.bits_per_word = bits,
		},
		{
		.tx_buf = (unsigned long)data,
		.rx_buf = (unsigned long)0,
		.len = len,
		.delay_usecs = delay,
		.speed_hz = speed,
		.bits_per_word = bits,
		}
	};
	msg_buf[0] = 0; //chip spi address
	msg_buf[1] = addr >> 8;
	msg_buf[2] = addr & 0xff;
	xfer[0].tx_buf = (unsigned long)msg_buf;
	xfer[0].len = 3;
	//printf("xfer[0].tx_buf:\n");
	//for(i = 0; i < 3; i++)
	//printf(" %.2x",*((char*)(xfer[0].tx_buf)+i));
	//printf("\n");
	
	//printf("xfer[1].tx_buf:\n");
	//for(i = 0; i < len; i++)
	//printf(" %.2x",*((char*)(xfer[1].tx_buf)+i));
	//printf("\n");

	if (mode & SPI_TX_QUAD)
		xfer[1].tx_nbits = 4;
	else if (mode & SPI_TX_DUAL)
		xfer[1].tx_nbits = 2;
	if (mode & SPI_RX_QUAD)
		xfer[1].rx_nbits = 4;
	else if (mode & SPI_RX_DUAL)
		xfer[1].rx_nbits = 2;
	if (!(mode & SPI_LOOP)) {
		if (mode & (SPI_TX_QUAD | SPI_TX_DUAL))
			xfer[1].rx_buf = 0;
		else if (mode & (SPI_RX_QUAD | SPI_RX_DUAL))
			xfer[1].tx_buf = 0;
	}

	ret = ioctl(i2s_fd, SPI_IOC_MESSAGE(2), xfer);
	if (ret < 1) {
		pabort("write: can't send spi message");
		return 1;
	}
	return 0;
}